

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void __thiscall Assimp::ColladaExporter::WriteGeometry(ColladaExporter *this,size_t pIndex)

{
  undefined1 *puVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  aiMesh *paVar4;
  aiFace *paVar5;
  uint uVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  int iVar9;
  size_t a;
  long lVar10;
  ulong uVar11;
  string *psVar12;
  size_t b;
  ulong uVar13;
  int iVar14;
  size_t a_1;
  string geometryId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string idstr;
  string geometryName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_270;
  string local_250;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  string local_1f0;
  string *local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  paVar4 = this->mScene->mMeshes[pIndex];
  if ((paVar4->mName).length == 0) {
    GetMeshId_abi_cxx11_(&local_1f0,this,pIndex);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,(paVar4->mName).data,(allocator<char> *)local_1a8);
  }
  XMLEscape(&local_1c8,&local_1f0);
  XMLIDEncode(&local_250,&local_1f0);
  if ((paVar4->mNumFaces != 0) && (paVar4->mNumVertices != 0)) {
    puVar1 = &this->field_0x38;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<geometry id=\"",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" name=\"",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" >",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    psVar12 = &this->startstr;
    std::__cxx11::string::append((char *)psVar12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<mesh>",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar12);
    paVar3 = &local_1a8[0].field_2;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append((char *)local_1a8);
    WriteFloatArray(this,local_1a8,FloatType_Vector,&paVar4->mVertices->x,
                    (ulong)paVar4->mNumVertices);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1f0._M_dataplus._M_p,
                 local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
      std::__cxx11::string::append((char *)local_1a8);
      WriteFloatArray(this,local_1a8,FloatType_Vector,&paVar4->mNormals->x,
                      (ulong)paVar4->mNumVertices);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    paVar3 = &local_270.field_2;
    lVar10 = 0;
    local_1d0 = psVar12;
    do {
      if ((paVar4->mTextureCoords[lVar10] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        std::__cxx11::string::append((char *)&local_210);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_210 != local_200) {
          uVar11 = local_200[0];
        }
        if (uVar11 < (ulong)(local_228 + local_208)) {
          uVar11 = 0xf;
          if (local_230 != local_220) {
            uVar11 = local_220[0];
          }
          if (uVar11 < (ulong)(local_228 + local_208)) goto LAB_00314ef6;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_00314ef6:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
        }
        psVar2 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_270.field_2._M_allocated_capacity = *psVar2;
          local_270.field_2._8_8_ = puVar8[3];
          local_270._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_270.field_2._M_allocated_capacity = *psVar2;
          local_270._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_270._M_string_length = puVar8[1];
        *puVar8 = psVar2;
        puVar8[1] = 0;
        *(undefined1 *)psVar2 = 0;
        WriteFloatArray(this,&local_270,
                        (paVar4->mNumUVComponents[lVar10] == 3) + FloatType_TexCoord2,
                        &paVar4->mTextureCoords[lVar10]->x,(ulong)paVar4->mNumVertices);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar3) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if (local_230 != local_220) {
          operator_delete(local_230,local_220[0] + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    lVar10 = 0;
    do {
      if ((paVar4->mColors[lVar10] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_1f0._M_dataplus._M_p,
                   local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
        std::__cxx11::string::append((char *)&local_210);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_210 != local_200) {
          uVar11 = local_200[0];
        }
        if (uVar11 < (ulong)(local_228 + local_208)) {
          uVar11 = 0xf;
          if (local_230 != local_220) {
            uVar11 = local_220[0];
          }
          if (uVar11 < (ulong)(local_228 + local_208)) goto LAB_003150b4;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_003150b4:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
        }
        psVar2 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_270.field_2._M_allocated_capacity = *psVar2;
          local_270.field_2._8_8_ = puVar8[3];
          local_270._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_270.field_2._M_allocated_capacity = *psVar2;
          local_270._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_270._M_string_length = puVar8[1];
        *puVar8 = psVar2;
        puVar8[1] = 0;
        *(undefined1 *)psVar2 = 0;
        WriteFloatArray(this,&local_270,FloatType_Color,&paVar4->mColors[lVar10]->r,
                        (ulong)paVar4->mNumVertices);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar3) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if (local_230 != local_220) {
          operator_delete(local_230,local_220[0] + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    psVar12 = local_1d0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<vertices id=\"",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-vertices",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\">",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    std::__cxx11::string::append((char *)psVar12);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"<input semantic=\"POSITION\" source=\"#",0x24);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-positions\" />",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</vertices>",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    if ((ulong)paVar4->mNumFaces != 0) {
      lVar10 = 0;
      iVar9 = 0;
      iVar14 = 0;
      do {
        uVar6 = *(uint *)((long)&paVar4->mFaces->mNumIndices + lVar10);
        iVar9 = (iVar9 + 1) - (uint)(uVar6 < 3);
        iVar14 = iVar14 + (uint)(uVar6 == 2);
        lVar10 = lVar10 + 0x10;
      } while ((ulong)paVar4->mNumFaces << 4 != lVar10);
      if (iVar14 != 0) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<lines count=\"",0xe);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" material=\"defaultMaterial\">",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar12);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#",0x2d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-vertices\" />",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"<input semantic=\"NORMAL\" source=\"#",0x22);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-normals\" />",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar10 = 0;
        do {
          if ((paVar4->mTextureCoords[lVar10] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0))
          {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"<input semantic=\"TEXCOORD\" source=\"#",0x24);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-tex",4);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"set=\"",5);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," />",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        lVar10 = 0;
        do {
          if ((paVar4->mColors[lVar10] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"<input semantic=\"COLOR\" source=\"#",0x21);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-color",6);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"set=\"",5);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," />",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<p>",3);
        uVar6 = paVar4->mNumFaces;
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            paVar5 = paVar4->mFaces;
            if (paVar5[uVar11].mNumIndices == 2) {
              uVar13 = 0;
              do {
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < paVar5[uVar11].mNumIndices);
              uVar6 = paVar4->mNumFaces;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</p>",4);
        psVar12 = local_1d0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length
                  );
        PopTag(this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</lines>",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
      if (iVar9 != 0) {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<polylist count=\"",0x11);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" material=\"defaultMaterial\">",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        std::__cxx11::string::append((char *)psVar12);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#",0x2d);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-vertices\" />",0xd);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                              (this->startstr)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"<input offset=\"0\" semantic=\"NORMAL\" source=\"#",0x2d);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-normals\" />",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
        }
        lVar10 = 0;
        do {
          if ((paVar4->mTextureCoords[lVar10] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0))
          {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#",0x2f);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-tex",4);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"set=\"",5);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," />",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        lVar10 = 0;
        do {
          if ((paVar4->mColors[lVar10] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                                (this->startstr)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"<input offset=\"0\" semantic=\"COLOR\" source=\"#",0x2c);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"-color",6);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"set=\"",5);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," />",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<vcount>",8);
        uVar6 = paVar4->mNumFaces;
        if (uVar6 != 0) {
          lVar10 = 0;
          uVar11 = 0;
          do {
            if (2 < *(uint *)((long)&paVar4->mFaces->mNumIndices + lVar10)) {
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              uVar6 = paVar4->mNumFaces;
            }
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x10;
          } while (uVar11 < uVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</vcount>",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length
                  );
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<p>",3);
        uVar6 = paVar4->mNumFaces;
        if (uVar6 != 0) {
          uVar11 = 0;
          do {
            paVar5 = paVar4->mFaces;
            if (2 < paVar5[uVar11].mNumIndices) {
              uVar13 = 0;
              do {
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                uVar13 = uVar13 + 1;
              } while (uVar13 < paVar5[uVar11].mNumIndices);
              uVar6 = paVar4->mNumFaces;
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</p>",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length
                  );
        PopTag(this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                            (this->startstr)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</polylist>",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
      }
    }
    PopTag(this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</mesh>",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
    PopTag(this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                        (this->startstr)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</geometry>",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteGeometry( size_t pIndex)
{
    const aiMesh* mesh = mScene->mMeshes[pIndex];
    const std::string idstr = mesh->mName.length == 0 ? GetMeshId(pIndex) : mesh->mName.C_Str();
    const std::string geometryName = XMLEscape(idstr);
    const std::string geometryId = XMLIDEncode(idstr);

    if ( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
        return;

    // opening tag
    mOutput << startstr << "<geometry id=\"" << geometryId << "\" name=\"" << geometryName << "\" >" << endstr;
    PushTag();

    mOutput << startstr << "<mesh>" << endstr;
    PushTag();

    // Positions
    WriteFloatArray( idstr + "-positions", FloatType_Vector, (ai_real*) mesh->mVertices, mesh->mNumVertices);
    // Normals, if any
    if( mesh->HasNormals() )
        WriteFloatArray( idstr + "-normals", FloatType_Vector, (ai_real*) mesh->mNormals, mesh->mNumVertices);

    // texture coords
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
        {
            WriteFloatArray( idstr + "-tex" + to_string(a), mesh->mNumUVComponents[a] == 3 ? FloatType_TexCoord3 : FloatType_TexCoord2,
                (ai_real*) mesh->mTextureCoords[a], mesh->mNumVertices);
        }
    }

    // vertex colors
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasVertexColors(static_cast<unsigned int>(a)) )
            WriteFloatArray( idstr + "-color" + to_string(a), FloatType_Color, (ai_real*) mesh->mColors[a], mesh->mNumVertices);
    }

    // assemble vertex structure
    // Only write input for POSITION since we will write other as shared inputs in polygon definition
    mOutput << startstr << "<vertices id=\"" << geometryId << "-vertices" << "\">" << endstr;
    PushTag();
    mOutput << startstr << "<input semantic=\"POSITION\" source=\"#" << geometryId << "-positions\" />" << endstr;
    PopTag();
    mOutput << startstr << "</vertices>" << endstr;

    // count the number of lines, triangles and polygon meshes
    int countLines = 0;
    int countPoly = 0;
    for( size_t a = 0; a < mesh->mNumFaces; ++a )
    {
        if (mesh->mFaces[a].mNumIndices == 2) countLines++;
        else if (mesh->mFaces[a].mNumIndices >= 3) countPoly++;
    }

    // lines
    if (countLines)
    {
        mOutput << startstr << "<lines count=\"" << countLines << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices != 2) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</lines>" << endstr;
    }

    // triangle - don't use it, because compatibility problems

    // polygons
    if (countPoly)
    {
        mOutput << startstr << "<polylist count=\"" << countPoly << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input offset=\"0\" semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<vcount>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            if (mesh->mFaces[a].mNumIndices < 3) continue;
            mOutput << mesh->mFaces[a].mNumIndices << " ";
        }
        mOutput << "</vcount>" << endstr;

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices < 3) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</polylist>" << endstr;
    }

    // closing tags
    PopTag();
    mOutput << startstr << "</mesh>" << endstr;
    PopTag();
    mOutput << startstr << "</geometry>" << endstr;
}